

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

bool __thiscall
QComboMenuDelegate::editorEvent
          (QComboMenuDelegate *this,QEvent *event,QAbstractItemModel *model,
          QStyleOptionViewItem *option,QModelIndex *index)

{
  bool bVar1;
  byte bVar2;
  Type TVar3;
  MouseButton MVar4;
  int iVar5;
  int iVar6;
  long *in_RDX;
  QEvent *in_RSI;
  QModelIndex *in_RDI;
  QModelIndex *in_R8;
  long in_FS_OFFSET;
  CheckState newState;
  QMouseEvent *me;
  ItemFlags flags;
  QVariant checkState;
  ItemFlag in_stack_ffffffffffffff3c;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  undefined8 in_stack_ffffffffffffff50;
  bool local_9d;
  bool local_59;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_58;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_54;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_50;
  undefined4 local_4c;
  QVariant local_48;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *local_10;
  long local_8;
  
  iVar5 = (int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_4c = 0xaaaaaaaa;
  local_4c = (**(code **)(*in_RDX + 0x138))(in_RDX,in_R8);
  local_50.super_QFlagsStorage<Qt::ItemFlag>.i =
       (QFlagsStorage<Qt::ItemFlag>)
       QFlags<Qt::ItemFlag>::operator&
                 ((QFlags<Qt::ItemFlag> *)
                  CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                  in_stack_ffffffffffffff3c);
  bVar1 = QFlags<Qt::ItemFlag>::operator!((QFlags<Qt::ItemFlag> *)&local_50);
  local_9d = true;
  if (!bVar1) {
    local_54.super_QFlagsStorage<QStyle::StateFlag>.i =
         (QFlagsStorage<QStyle::StateFlag>)
         QFlags<QStyle::StateFlag>::operator&
                   ((QFlags<QStyle::StateFlag> *)
                    CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                    in_stack_ffffffffffffff3c);
    bVar1 = QFlags<QStyle::StateFlag>::operator!((QFlags<QStyle::StateFlag> *)&local_54);
    local_9d = true;
    if (!bVar1) {
      local_58.super_QFlagsStorage<Qt::ItemFlag>.i =
           (QFlagsStorage<Qt::ItemFlag>)
           QFlags<Qt::ItemFlag>::operator&
                     ((QFlags<Qt::ItemFlag> *)
                      CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                      in_stack_ffffffffffffff3c);
      local_9d = QFlags<Qt::ItemFlag>::operator!((QFlags<Qt::ItemFlag> *)&local_58);
    }
  }
  if (local_9d != false) {
    local_59 = false;
    goto LAB_005305cf;
  }
  local_28.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::data(in_RDI,iVar5);
  bVar1 = ::QVariant::isValid((QVariant *)
                              CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
  if (bVar1) {
    TVar3 = QEvent::type(in_RSI);
    if (((TVar3 == MouseButtonRelease) ||
        (TVar3 = QEvent::type(in_RSI), TVar3 == MouseButtonDblClick)) ||
       (TVar3 = QEvent::type(in_RSI), TVar3 == MouseButtonPress)) {
      MVar4 = QSinglePointEvent::button((QSinglePointEvent *)in_RSI);
      if (MVar4 == LeftButton) {
        TVar3 = QEvent::type(in_RSI);
        if ((TVar3 == MouseButtonPress) ||
           (TVar3 = QEvent::type(in_RSI), TVar3 == MouseButtonDblClick)) {
          iVar5 = QModelIndex::row(in_R8);
          in_RDI[1].r = iVar5;
          local_59 = false;
        }
        else {
          iVar5 = QModelIndex::row(in_R8);
          if (iVar5 == in_RDI[1].r) {
            in_RDI[1].r = -1;
            goto LAB_0053053e;
          }
          local_59 = false;
        }
      }
      else {
        local_59 = false;
      }
    }
    else {
      TVar3 = QEvent::type(in_RSI);
      if (TVar3 == KeyPress) {
        iVar5 = QKeyEvent::key((QKeyEvent *)in_RSI);
        if ((iVar5 == 0x20) || (iVar5 = QKeyEvent::key((QKeyEvent *)in_RSI), iVar5 == 0x1010000)) {
LAB_0053053e:
          iVar5 = ::QVariant::toInt((bool *)local_28.data);
          iVar6 = 2;
          if (iVar5 == 2) {
            iVar6 = 0;
          }
          ::QVariant::QVariant(&local_48,iVar6);
          bVar2 = (**(code **)(*in_RDX + 0x98))(in_RDX,in_R8,&local_48,10);
          local_59 = (bool)(bVar2 & 1);
          ::QVariant::~QVariant(&local_48);
        }
        else {
          local_59 = false;
        }
      }
      else {
        local_59 = false;
      }
    }
  }
  else {
    local_59 = false;
  }
  ::QVariant::~QVariant((QVariant *)&local_28);
LAB_005305cf:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_59;
}

Assistant:

bool QComboMenuDelegate::editorEvent(QEvent *event, QAbstractItemModel *model,
                                     const QStyleOptionViewItem &option, const QModelIndex &index)
{
    Q_ASSERT(event);
    Q_ASSERT(model);

    // make sure that the item is checkable
    Qt::ItemFlags flags = model->flags(index);
    if (!(flags & Qt::ItemIsUserCheckable) || !(option.state & QStyle::State_Enabled)
        || !(flags & Qt::ItemIsEnabled))
        return false;

    // make sure that we have a check state
    const QVariant checkState = index.data(Qt::CheckStateRole);
    if (!checkState.isValid())
        return false;

    // make sure that we have the right event type
    if ((event->type() == QEvent::MouseButtonRelease)
        || (event->type() == QEvent::MouseButtonDblClick)
        || (event->type() == QEvent::MouseButtonPress)) {
        QMouseEvent *me = static_cast<QMouseEvent*>(event);
        if (me->button() != Qt::LeftButton)
            return false;

        if ((event->type() == QEvent::MouseButtonPress)
            || (event->type() == QEvent::MouseButtonDblClick)) {
            pressedIndex = index.row();
            return false;
        }

        if (index.row() != pressedIndex)
            return false;
        pressedIndex = -1;

    } else if (event->type() == QEvent::KeyPress) {
        if (static_cast<QKeyEvent*>(event)->key() != Qt::Key_Space
         && static_cast<QKeyEvent*>(event)->key() != Qt::Key_Select)
            return false;
    } else {
        return false;
    }

    // we don't support user-tristate items in QComboBox (not implemented in any style)
    Qt::CheckState newState = (static_cast<Qt::CheckState>(checkState.toInt()) == Qt::Checked)
                            ? Qt::Unchecked : Qt::Checked;
    return model->setData(index, newState, Qt::CheckStateRole);
}